

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void GC::CheckArrayElements(char *ptr,uint size,ExternTypeInfo *elementType)

{
  uint local_30;
  uint local_2c;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  ExternTypeInfo *elementType_local;
  char *pcStack_10;
  uint size_local;
  char *ptr_local;
  
  if (elementType->pointerCount != 0) {
    pcStack_10 = ptr;
    switch(elementType->subCat) {
    case CAT_NONE:
      break;
    case CAT_ARRAY:
      for (i_2 = 0; i_2 < size; i_2 = i_2 + 1) {
        CheckArray(pcStack_10,elementType);
        pcStack_10 = pcStack_10 + elementType->size;
      }
      break;
    case CAT_POINTER:
      for (i_3 = 0; i_3 < size; i_3 = i_3 + 1) {
        CheckPointer(pcStack_10);
        pcStack_10 = pcStack_10 + elementType->size;
      }
      break;
    case CAT_FUNCTION:
      for (local_2c = 0; local_2c < size; local_2c = local_2c + 1) {
        CheckFunction(pcStack_10);
        pcStack_10 = pcStack_10 + elementType->size;
      }
      break;
    case CAT_CLASS:
      for (local_30 = 0; local_30 < size; local_30 = local_30 + 1) {
        CheckClass(pcStack_10,elementType);
        pcStack_10 = pcStack_10 + elementType->size;
      }
    }
  }
  return;
}

Assistant:

void CheckArrayElements(char* ptr, unsigned size, const ExternTypeInfo& elementType)
	{
		if(!elementType.pointerCount)
			return;

		// Check every array element
		switch(elementType.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
			break;
		case ExternTypeInfo::CAT_ARRAY:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckArray(ptr, elementType);
			break;
		case ExternTypeInfo::CAT_POINTER:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckPointer(ptr);
			break;
		case ExternTypeInfo::CAT_FUNCTION:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckFunction(ptr);
			break;
		case ExternTypeInfo::CAT_CLASS:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckClass(ptr, elementType);
			break;
		}
	}